

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase745::run(TestCase745 *this)

{
  size_t sVar1;
  Own<kj::Directory,_std::nullptr_t> OVar2;
  StringPtr text;
  Array<kj::String> local_b8;
  Own<const_kj::File,_std::nullptr_t> file;
  Own<kj::Directory,_std::nullptr_t> dir;
  DebugComparison<kj::String,_const_char_(&)[7]> _kjCondition;
  Array<kj::String> local_48;
  TempDir tempDir;
  
  TempDir::TempDir(&tempDir);
  OVar2 = TempDir::get((TempDir *)&dir);
  (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xf])(&file,dir.ptr,OVar2.ptr);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll(file.ptr,text);
  ReadableFile::readAllText((String *)&local_b8,&(file.ptr)->super_ReadableFile);
  local_48.ptr = local_b8.ptr;
  local_48.size_ = local_b8.size_;
  local_48.disposer = local_b8.disposer;
  local_b8.ptr = (String *)0x0;
  local_b8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&local_48,(char (*) [7])0x42451a);
  Array<char>::~Array((Array<char> *)&local_48);
  Array<char>::~Array((Array<char> *)&local_b8);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ee,ERROR,
               "\"failed: expected \" \"file->readAllText() == \\\"foobar\\\"\", _kjCondition",
               (char (*) [49])"failed: expected file->readAllText() == \"foobar\"",&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[6])(&local_b8);
  sVar1 = local_b8.size_;
  _kjCondition.left.content.ptr = (char *)local_b8.ptr;
  local_48.disposer = local_b8.disposer;
  _kjCondition.right = (char (*) [7])0x0;
  local_b8.ptr = (String *)0x0;
  local_b8.size_ = 0;
  _kjCondition.result = sVar1 == 0;
  _kjCondition.left.content.size_ = sVar1;
  _kjCondition.left.content.disposer = local_b8.disposer;
  local_48.ptr = (String *)0x0;
  local_48.size_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  Array<kj::String>::~Array(&local_48);
  Array<kj::String>::~Array(&local_b8);
  if ((sVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[45],kj::_::DebugComparison<kj::Array<kj::String>,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ef,ERROR,"\"failed: expected \" \"dir->listNames() == nullptr\", _kjCondition",
               (char (*) [45])"failed: expected dir->listNames() == nullptr",
               (DebugComparison<kj::Array<kj::String>,_std::nullptr_t> *)&_kjCondition);
  }
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  Own<const_kj::File,_std::nullptr_t>::dispose(&file);
  Own<kj::Directory,_std::nullptr_t>::dispose(&dir);
  TempDir::~TempDir(&tempDir);
  return;
}

Assistant:

TEST(AsyncIo, ScmRightsTruncatedOdd) {
  // Test that if we send two FDs over a unix socket, but the receiving end only receives one, we
  // don't leak the other FD.

  auto io = setupAsyncIo();

  auto capPipe = io.provider->newCapabilityPipe();

  int pipeFds[2]{};
  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in1(pipeFds[0]);
  kj::OwnFd out1(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in2(pipeFds[0]);
  kj::OwnFd out2(pipeFds[1]);

  {
    OwnFd sendFds[2] = { kj::mv(out1), kj::mv(out2) };
    capPipe.ends[0]->writeWithFds("foo"_kjb, nullptr, sendFds).wait(io.waitScope);
  }

  {
    char buffer[4]{};
    OwnFd fdBuffer[1];
    auto result = capPipe.ends[1]->tryReadWithFds(buffer, 3, 3, fdBuffer, 1).wait(io.waitScope);
    KJ_ASSERT(result.capCount == 1);
    kj::FdOutputStream(fdBuffer[0].get()).write("bar"_kjb);
  }

  // We want to carefully verify that out1 and out2 were closed, without deadlocking if they
  // weren't. So we manually set nonblocking mode and then issue read()s.
  KJ_SYSCALL(fcntl(in1, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in2, F_SETFL, O_NONBLOCK));

  char buffer[4]{};
  ssize_t n;

  // First we read "bar" from in1.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "bar");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out1 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Second pipe should have been closed implicitly because we didn't provide space to receive it.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out2 was not closed. This could indicate that your operating system kernel is "
        "buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was "
        "known to do this until late 2018, while MacOS still has this bug as of this writing in "
        "2019. However, KJ works around the problem on those platforms. You need to enable the "
        "same work-around for your OS -- search for 'SCM_RIGHTS' in src/kj/async-io-unix.c++.");
  }
  KJ_ASSERT(n == 0);
}